

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::sse2::BVHNBuilderMBlurSAHGrid<4>::createPrimRefArrayMSMBlurGrid
          (PrimInfoMB *__return_storage_ptr__,BVHNBuilderMBlurSAHGrid<4> *this,Scene *scene,
          mvector<PrimRefMB> *prims,BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  Geometry *pGVar5;
  Ref<embree::Geometry> *pRVar6;
  SubGridBuildData *ptr;
  PrimRefMB *ptr_00;
  MemoryMonitorInterface *pMVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  size_t sVar10;
  undefined8 uVar11;
  BBox1f BVar12;
  char cVar13;
  int iVar14;
  ulong uVar15;
  unsigned_long uVar16;
  SubGridBuildData *pSVar17;
  PrimRefMB *pPVar18;
  runtime_error *prVar19;
  ulong uVar20;
  ulong uVar21;
  BBox1f BVar22;
  long lVar23;
  ulong uVar24;
  mvector<PrimRefMB> *pmVar25;
  size_t sVar26;
  BBox1f *pBVar27;
  ParallelPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pPVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  BBox1f BVar33;
  unsigned_long uVar34;
  bool bVar35;
  uint uVar36;
  uint uVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar41;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar42;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar43;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar45;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar46;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar47;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar49;
  float fVar50;
  float fVar51;
  float fVar53;
  BBox1f BVar52;
  size_t taskCount_1;
  size_t taskCount;
  Iterator<embree::GridMesh,_true> iter;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  anon_class_1_0_00000001 local_4dea;
  auto_partitioner local_4de9;
  mvector<PrimRefMB> *local_4de8;
  BBox1f local_4de0;
  BBox1f local_4dd8;
  BBox1f local_4dd0;
  BBox1f local_4dc8;
  Scene *local_4dc0;
  bool local_4db8;
  anon_class_16_2_341d598e_conflict2 local_4db0;
  anon_class_16_2_341d598e_conflict2 local_4da0;
  mvector<PrimRefMB> *local_4d90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4d88;
  undefined8 local_4d78;
  undefined8 uStack_4d70;
  undefined8 local_4d68;
  undefined8 uStack_4d60;
  undefined8 local_4d58;
  undefined8 uStack_4d50;
  undefined8 local_4d48;
  undefined8 uStack_4d40;
  undefined8 local_4d38;
  undefined8 uStack_4d30;
  unsigned_long local_4d28;
  unsigned_long uStack_4d20;
  size_t local_4d18;
  size_t sStack_4d10;
  float local_4d08;
  float fStack_4d04;
  float fStack_4d00;
  float fStack_4cfc;
  anon_class_48_6_afa08d2e_conflict2 local_4cf8;
  task_group_context local_4cc8;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> local_4c48;
  
  local_4c48.super_ParallelForForState.taskCount = 0;
  local_4db8 = false;
  sVar29 = (scene->geometries).size_active;
  if (sVar29 == 0) {
    uVar32 = 0;
  }
  else {
    uVar32 = 0;
    sVar26 = 0;
    do {
      pGVar5 = (scene->geometries).items[sVar26].ptr;
      if (((pGVar5 == (Geometry *)0x0) || (((uint)pGVar5->field_8 & 0x2000ff) != 0x200016)) ||
         (pGVar5->numTimeSteps == 1)) {
        uVar20 = 0;
      }
      else {
        uVar20 = (ulong)pGVar5->numPrimitives;
      }
      uVar32 = uVar32 + uVar20;
      sVar26 = sVar26 + 1;
    } while (sVar29 != sVar26);
  }
  local_4de8 = prims;
  local_4de0 = t0t1;
  local_4dc0 = scene;
  local_4c48.super_ParallelForForState.N = uVar32;
  iVar14 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar20 = uVar32 + 0x3ff >> 10;
  if ((ulong)(long)iVar14 < uVar20) {
    uVar20 = (long)iVar14;
  }
  uVar31 = 0x40;
  if (uVar20 < 0x40) {
    uVar31 = uVar20;
  }
  BVar33 = (BBox1f)(uVar31 + (uVar31 == 0));
  local_4c48.super_ParallelForForState.i0[0] = 0;
  local_4c48.super_ParallelForForState.j0[0] = 0;
  local_4c48.super_ParallelForForState.taskCount = (size_t)BVar33;
  if (1 < uVar20) {
    uVar31 = 0;
    uVar20 = uVar32 / (ulong)BVar33;
    pRVar6 = (scene->geometries).items;
    BVar22.lower = 1.4013e-45;
    BVar22.upper = 0.0;
    sVar29 = 0;
    do {
      pGVar5 = pRVar6[sVar29].ptr;
      if (((pGVar5 == (Geometry *)0x0) || (((uint)pGVar5->field_8 & 0x2000ff) != 0x200016)) ||
         ((pGVar5->numTimeSteps == 1 || (uVar30 = (ulong)pGVar5->numPrimitives, uVar30 == 0)))) {
        uVar30 = 0;
        lVar23 = 0;
      }
      else {
        uVar21 = ((long)BVar22 + 1U) * uVar32;
        lVar23 = 0;
        uVar24 = 0;
        do {
          uVar15 = uVar20;
          uVar20 = uVar15;
          if ((uVar31 + uVar30 + lVar23 < uVar15) || ((ulong)BVar33 <= (ulong)BVar22)) break;
          local_4c48.super_ParallelForForState.i0[(long)BVar22] = sVar29;
          uVar24 = uVar24 + (uVar15 - uVar31);
          local_4c48.super_ParallelForForState.j0[(long)BVar22] = uVar24;
          BVar22 = (BBox1f)((long)BVar22 + 1);
          uVar20 = uVar21 / local_4c48.super_ParallelForForState.taskCount;
          lVar23 = -uVar24;
          uVar21 = uVar21 + uVar32;
          uVar31 = uVar15;
          BVar33 = (BBox1f)local_4c48.super_ParallelForForState.taskCount;
        } while (uVar24 < uVar30);
      }
      uVar31 = uVar30 + uVar31 + lVar23;
      sVar29 = sVar29 + 1;
    } while ((ulong)BVar22 < (ulong)BVar33);
  }
  local_4cf8.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d88;
  local_4d88._0_8_ = 0x7f8000007f800000;
  local_4d88._8_8_ = 0x7f8000007f800000;
  local_4d78 = 0xff800000ff800000;
  uStack_4d70 = 0xff800000ff800000;
  local_4d68 = 0x7f8000007f800000;
  uStack_4d60 = 0x7f8000007f800000;
  local_4d58 = 0xff800000ff800000;
  uStack_4d50 = 0xff800000ff800000;
  local_4d48 = 0x7f8000007f800000;
  uStack_4d40 = 0x7f8000007f800000;
  local_4d38 = 0xff800000ff800000;
  uStack_4d30 = 0xff800000ff800000;
  local_4d28 = 0;
  uStack_4d20 = 0;
  local_4d18 = 0;
  sStack_4d10 = 0;
  local_4d08 = 0.0;
  fStack_4d04 = 1.0;
  fStack_4d00 = 1.0;
  fStack_4cfc = 0.0;
  local_4dd0 = (BBox1f)&local_4de0;
  local_4da0.func = (anon_class_8_1_89912a77 *)&local_4dd0;
  local_4dd8 = (BBox1f)&local_4dc0;
  local_4cf8.getSize = (anon_class_8_1_4d25ca37_conflict *)&local_4dd8;
  local_4cf8.func = &local_4da0;
  local_4cf8.taskCount = (size_t *)&local_4dc8;
  local_4cf8.state = &local_4c48;
  local_4cf8.reduction = &local_4dea;
  local_4cc8.my_version = proxy_support;
  local_4cc8.my_traits = (context_traits)0x4;
  local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_4cc8.my_name = CUSTOM_CTX;
  local_4dc8 = BVar33;
  local_4da0.array2 = (Iterator<embree::GridMesh,_true> *)local_4dd8;
  tbb::detail::r1::initialize(&local_4cc8);
  local_4db0.func = (anon_class_8_1_89912a77 *)&local_4cf8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,(unsigned_long)BVar33,1,(anon_class_8_1_898bcfc2_conflict10 *)&local_4db0,&local_4de9
             ,&local_4cc8);
  cVar13 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
  pmVar25 = local_4de8;
  if (cVar13 != '\0') {
    prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar19,"task cancelled");
    __cxa_throw(prVar19,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_4cc8);
  aVar38._8_8_ = local_4d88._8_8_;
  aVar38._0_8_ = local_4d88._0_8_;
  aVar40._8_8_ = uStack_4d70;
  aVar40._0_8_ = local_4d78;
  aVar42._8_8_ = uStack_4d60;
  aVar42._0_8_ = local_4d68;
  aVar44._8_8_ = uStack_4d50;
  aVar44._0_8_ = local_4d58;
  aVar46._8_8_ = uStack_4d40;
  aVar46._0_8_ = local_4d48;
  aVar48._8_8_ = uStack_4d30;
  aVar48._0_8_ = local_4d38;
  (__return_storage_ptr__->object_range)._begin = local_4d28;
  (__return_storage_ptr__->object_range)._end = uStack_4d20;
  BVar33.upper = fStack_4d04;
  BVar33.lower = local_4d08;
  BVar12.upper = fStack_4cfc;
  BVar12.lower = fStack_4d00;
  __return_storage_ptr__->max_time_range = BVar33;
  __return_storage_ptr__->time_range = BVar12;
  __return_storage_ptr__->num_time_segments = local_4d18;
  __return_storage_ptr__->max_num_time_segments = sStack_4d10;
  uVar16 = local_4d28;
  uVar34 = uStack_4d20;
  if (local_4dc8 != (BBox1f)0x0) {
    sVar29 = __return_storage_ptr__->num_time_segments;
    sVar26 = __return_storage_ptr__->max_num_time_segments;
    pPVar28 = &local_4c48.prefix_state;
    BVar33 = __return_storage_ptr__->max_time_range;
    BVar22 = local_4dc8;
    fVar51 = (__return_storage_ptr__->time_range).upper;
    fVar53 = (__return_storage_ptr__->time_range).lower;
    do {
      uVar20 = pPVar28->counts[0].max_num_time_segments;
      uVar32._0_4_ = pPVar28->counts[0].max_time_range.lower;
      uVar32._4_4_ = pPVar28->counts[0].max_time_range.upper;
      fVar3 = pPVar28->counts[0].time_range.upper;
      pPVar28->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
      field_0 = aVar38;
      pPVar28->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
      field_0 = aVar40;
      pPVar28->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
      field_0 = aVar42;
      pPVar28->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
      field_0 = aVar44;
      pPVar28->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0 =
           aVar46;
      pPVar28->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0 =
           aVar48;
      aVar38.m128 = (__m128)minps(aVar38.m128,
                                  pPVar28->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  geomBounds.bounds0.lower.field_0);
      aVar40.m128 = (__m128)maxps(aVar40.m128,
                                  pPVar28->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  geomBounds.bounds0.upper.field_0);
      aVar42.m128 = (__m128)minps(aVar42.m128,
                                  pPVar28->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  geomBounds.bounds1.lower.field_0);
      aVar44.m128 = (__m128)maxps(aVar44.m128,
                                  pPVar28->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  geomBounds.bounds1.upper.field_0);
      aVar46.m128 = (__m128)minps(aVar46.m128,
                                  pPVar28->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  centBounds.lower.field_0);
      aVar48.m128 = (__m128)maxps(aVar48.m128,
                                  pPVar28->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  centBounds.upper.field_0);
      fVar4 = pPVar28->counts[0].time_range.lower;
      fVar50 = fVar53;
      if (fVar4 <= fVar53) {
        fVar50 = fVar4;
      }
      uVar16 = uVar16 + pPVar28->counts[0].object_range._begin;
      uVar34 = uVar34 + pPVar28->counts[0].object_range._end;
      sVar29 = sVar29 + pPVar28->counts[0].num_time_segments;
      uVar8 = (__return_storage_ptr__->object_range)._begin;
      uVar9 = (__return_storage_ptr__->object_range)._end;
      sVar10 = __return_storage_ptr__->max_num_time_segments;
      pPVar28->sums[0].num_time_segments = __return_storage_ptr__->num_time_segments;
      pPVar28->sums[0].max_num_time_segments = sVar10;
      pPVar28->sums[0].object_range._begin = uVar8;
      pPVar28->sums[0].object_range._end = uVar9;
      pPVar28->sums[0].max_time_range = BVar33;
      pPVar28->sums[0].time_range.lower = fVar53;
      pPVar28->sums[0].time_range.upper = fVar51;
      bVar35 = sVar26 < uVar20;
      if (sVar26 <= uVar20) {
        sVar26 = uVar20;
      }
      if (fVar3 <= fVar51) {
        fVar3 = fVar51;
      }
      uVar20 = CONCAT44((int)((uint)bVar35 << 0x1f) >> 0x1f,(int)((uint)bVar35 << 0x1f) >> 0x1f);
      BVar33 = (BBox1f)(~uVar20 & (ulong)BVar33 | uVar32 & uVar20);
      (__return_storage_ptr__->object_range)._begin = uVar16;
      (__return_storage_ptr__->object_range)._end = uVar34;
      __return_storage_ptr__->num_time_segments = sVar29;
      __return_storage_ptr__->max_num_time_segments = sVar26;
      pPVar28 = (ParallelPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *)
                (pPVar28->counts + 1);
      BVar22 = (BBox1f)((long)BVar22 - 1);
      fVar51 = fVar3;
      fVar53 = fVar50;
    } while (BVar22 != (BBox1f)0x0);
    __return_storage_ptr__->max_time_range = BVar33;
    (__return_storage_ptr__->time_range).lower = fVar50;
    (__return_storage_ptr__->time_range).upper = fVar3;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar38;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar40;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar42;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar44;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar46;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar48;
  uVar32 = uVar34 - uVar16;
  if (uVar32 == 0) {
    return __return_storage_ptr__;
  }
  uVar20 = (this->sgrids).size_alloced;
  uVar31 = uVar20;
  if ((uVar20 < uVar32) && (uVar31 = uVar32, uVar30 = uVar20, uVar20 != 0)) {
    do {
      uVar31 = uVar30 * 2 + (ulong)(uVar30 * 2 == 0);
      uVar30 = uVar31;
    } while (uVar31 < uVar32);
  }
  if (uVar32 < (this->sgrids).size_active) {
    (this->sgrids).size_active = uVar32;
  }
  if (uVar20 == uVar31) {
    (this->sgrids).size_active = uVar32;
  }
  else {
    pMVar7 = (this->sgrids).alloc.device;
    ptr = (this->sgrids).items;
    uVar20 = uVar31 * 8;
    (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,uVar20,0);
    if (uVar20 < 0x1c00000) {
      pSVar17 = (SubGridBuildData *)alignedMalloc(uVar20,4);
    }
    else {
      pSVar17 = (SubGridBuildData *)os_malloc(uVar20,&(this->sgrids).alloc.hugepages);
    }
    (this->sgrids).items = pSVar17;
    if ((this->sgrids).size_active == 0) {
      sVar29 = (this->sgrids).size_alloced;
      if (ptr != (SubGridBuildData *)0x0) goto LAB_00c8da0d;
    }
    else {
      uVar20 = 0;
      do {
        (this->sgrids).items[uVar20] = ptr[uVar20];
        uVar20 = uVar20 + 1;
      } while (uVar20 < (this->sgrids).size_active);
      sVar29 = (this->sgrids).size_alloced;
LAB_00c8da0d:
      if (sVar29 * 8 < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,sVar29 * 8,(this->sgrids).alloc.hugepages);
      }
    }
    if (sVar29 != 0) {
      pMVar7 = (this->sgrids).alloc.device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar29 * -8,1);
    }
    (this->sgrids).size_active = uVar32;
    (this->sgrids).size_alloced = uVar31;
    pmVar25 = local_4de8;
  }
  uVar20 = pmVar25->size_alloced;
  uVar31 = uVar20;
  if ((uVar20 < uVar32) && (uVar31 = uVar32, uVar30 = uVar20, uVar20 != 0)) {
    do {
      uVar31 = uVar30 * 2 + (ulong)(uVar30 * 2 == 0);
      uVar30 = uVar31;
    } while (uVar31 < uVar32);
  }
  if (uVar32 < pmVar25->size_active) {
    pmVar25->size_active = uVar32;
  }
  if (uVar20 == uVar31) {
    pmVar25->size_active = uVar32;
    goto LAB_00c8dbbb;
  }
  ptr_00 = pmVar25->items;
  if (uVar31 == 0) {
    uVar20 = 0;
LAB_00c8dade:
    pPVar18 = (PrimRefMB *)alignedMalloc(uVar20,0x10);
  }
  else {
    pMVar7 = (pmVar25->alloc).device;
    uVar20 = uVar31 * 0x50;
    (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,uVar20,0);
    if (uVar20 < 0x1c00000) goto LAB_00c8dade;
    pPVar18 = (PrimRefMB *)os_malloc(uVar20,&(local_4de8->alloc).hugepages);
  }
  local_4de8->items = pPVar18;
  if (local_4de8->size_active == 0) {
    sVar29 = local_4de8->size_alloced;
    if (ptr_00 != (PrimRefMB *)0x0) goto LAB_00c8db57;
  }
  else {
    lVar23 = 0x40;
    uVar20 = 0;
    do {
      pPVar18 = local_4de8->items;
      puVar1 = (undefined8 *)((long)ptr_00 + lVar23 + -0x40);
      uVar11 = puVar1[1];
      puVar2 = (undefined8 *)((long)pPVar18 + lVar23 + -0x40);
      *puVar2 = *puVar1;
      puVar2[1] = uVar11;
      puVar1 = (undefined8 *)((long)ptr_00 + lVar23 + -0x30);
      uVar11 = puVar1[1];
      puVar2 = (undefined8 *)((long)pPVar18 + lVar23 + -0x30);
      *puVar2 = *puVar1;
      puVar2[1] = uVar11;
      puVar1 = (undefined8 *)((long)ptr_00 + lVar23 + -0x20);
      uVar11 = puVar1[1];
      puVar2 = (undefined8 *)((long)pPVar18 + lVar23 + -0x20);
      *puVar2 = *puVar1;
      puVar2[1] = uVar11;
      puVar1 = (undefined8 *)((long)ptr_00 + lVar23 + -0x10);
      uVar11 = puVar1[1];
      puVar2 = (undefined8 *)((long)pPVar18 + lVar23 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar11;
      *(undefined8 *)((long)&(pPVar18->lbounds).bounds0.lower.field_0 + lVar23) =
           *(undefined8 *)((long)&(ptr_00->lbounds).bounds0.lower.field_0 + lVar23);
      uVar20 = uVar20 + 1;
      lVar23 = lVar23 + 0x50;
    } while (uVar20 < local_4de8->size_active);
    sVar29 = local_4de8->size_alloced;
LAB_00c8db57:
    if (sVar29 * 0x50 < 0x1c00000) {
      alignedFree(ptr_00);
    }
    else {
      os_free(ptr_00,sVar29 * 0x50,(local_4de8->alloc).hugepages);
    }
  }
  pmVar25 = local_4de8;
  if (sVar29 != 0) {
    pMVar7 = (local_4de8->alloc).device;
    (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar29 * -0x50,1);
  }
  pmVar25->size_active = uVar32;
  pmVar25->size_alloced = uVar31;
LAB_00c8dbbb:
  sVar29 = local_4c48.super_ParallelForForState.taskCount;
  local_4d88._0_8_ = 0x7f8000007f800000;
  local_4d88._8_8_ = 0x7f8000007f800000;
  local_4d78 = 0xff800000ff800000;
  uStack_4d70 = 0xff800000ff800000;
  local_4d68 = 0x7f8000007f800000;
  uStack_4d60 = 0x7f8000007f800000;
  local_4d58 = 0xff800000ff800000;
  uStack_4d50 = 0xff800000ff800000;
  local_4d48 = 0x7f8000007f800000;
  uStack_4d40 = 0x7f8000007f800000;
  local_4d38 = 0xff800000ff800000;
  uStack_4d30 = 0xff800000ff800000;
  local_4d28 = 0;
  uStack_4d20 = 0;
  local_4d18 = 0;
  sStack_4d10 = 0;
  local_4d08 = 0.0;
  fStack_4d04 = 1.0;
  fStack_4d00 = 1.0;
  fStack_4cfc = 0.0;
  local_4da0.func = (anon_class_8_1_89912a77 *)&local_4de0;
  local_4dd0 = (BBox1f)&local_4dc0;
  local_4db0.func = (anon_class_8_1_89912a77 *)&local_4da0;
  local_4dd8.lower = (float)(undefined4)local_4c48.super_ParallelForForState.taskCount;
  local_4dd8.upper = (float)local_4c48.super_ParallelForForState.taskCount._4_4_;
  local_4cf8.state = &local_4c48;
  local_4cf8.taskCount = (size_t *)&local_4dd8;
  local_4cf8.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d88;
  local_4cf8.getSize = (anon_class_8_1_4d25ca37_conflict *)&local_4dd0;
  local_4cf8.reduction = &local_4dea;
  local_4cf8.func = &local_4db0;
  local_4cc8.my_version = proxy_support;
  local_4cc8.my_traits = (context_traits)0x4;
  local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_4cc8.my_name = CUSTOM_CTX;
  local_4db0.array2 = (Iterator<embree::GridMesh,_true> *)local_4dd0;
  local_4da0.array2 = (Iterator<embree::GridMesh,_true> *)this;
  local_4d90 = pmVar25;
  tbb::detail::r1::initialize(&local_4cc8);
  local_4dc8 = (BBox1f)&local_4cf8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,sVar29,1,(anon_class_8_1_898bcfc2_conflict10 *)&local_4dc8,&local_4de9,&local_4cc8);
  cVar13 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
  if (cVar13 == '\0') {
    tbb::detail::r1::destroy(&local_4cc8);
    aVar49._8_8_ = local_4d88._8_8_;
    aVar49._0_8_ = local_4d88._0_8_;
    aVar47._8_8_ = uStack_4d70;
    aVar47._0_8_ = local_4d78;
    aVar45._8_8_ = uStack_4d60;
    aVar45._0_8_ = local_4d68;
    aVar43._8_8_ = uStack_4d50;
    aVar43._0_8_ = local_4d58;
    aVar41._8_8_ = uStack_4d40;
    aVar41._0_8_ = local_4d48;
    aVar39._8_8_ = uStack_4d30;
    aVar39._0_8_ = local_4d38;
    BVar52.upper = fStack_4d04;
    BVar52.lower = local_4d08;
    if (local_4dd8 != (BBox1f)0x0) {
      pBVar27 = &local_4c48.prefix_state.sums[0].time_range;
      do {
        uVar20 = *(ulong *)(pBVar27 + -0x482);
        uVar32 = *(ulong *)(pBVar27 + -0x481);
        (((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)(pBVar27 + -0x11))->
        super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0 = aVar49;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar27 + -0xf) = aVar47;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar27 + -0xd) = aVar45;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar27 + -0xb) = aVar43;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar27 + -9) = aVar41;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar27 + -7) = aVar39;
        ((range<unsigned_long> *)(pBVar27 + -5))->_begin = local_4d28;
        pBVar27[-4] = (BBox1f)uStack_4d20;
        pBVar27[-3] = (BBox1f)local_4d18;
        pBVar27[-2] = (BBox1f)sStack_4d10;
        pBVar27[-1] = BVar52;
        aVar49.m128 = (__m128)minps(aVar49.m128,*(undefined1 (*) [16])(pBVar27 + -0x491));
        aVar47.m128 = (__m128)maxps(aVar47.m128,*(undefined1 (*) [16])(pBVar27 + -0x48f));
        aVar45.m128 = (__m128)minps(aVar45.m128,*(undefined1 (*) [16])(pBVar27 + -0x48d));
        aVar43.m128 = (__m128)maxps(aVar43.m128,*(undefined1 (*) [16])(pBVar27 + -0x48b));
        aVar41.m128 = (__m128)minps(aVar41.m128,*(undefined1 (*) [16])(pBVar27 + -0x489));
        aVar39.m128 = (__m128)maxps(aVar39.m128,*(undefined1 (*) [16])(pBVar27 + -0x487));
        local_4d28 = local_4d28 + *(long *)(pBVar27 + -0x485);
        uStack_4d20 = uStack_4d20 + *(long *)(pBVar27 + -0x484);
        local_4d18 = local_4d18 + *(long *)(pBVar27 + -0x483);
        pBVar27->lower = fStack_4d00;
        pBVar27->upper = fStack_4cfc;
        fVar51 = SUB84(pBVar27[-0x480],0);
        fVar53 = (float)((ulong)pBVar27[-0x480] >> 0x20);
        uVar36 = -(uint)(fStack_4d00 < fVar51);
        uVar37 = -(uint)(fStack_4cfc < fVar53);
        fStack_4d00 = (float)(~uVar36 & (uint)fVar51 | (uint)fStack_4d00 & uVar36);
        fStack_4cfc = (float)(~uVar37 & (uint)fStack_4cfc | (uint)fVar53 & uVar37);
        bVar35 = sStack_4d10 < uVar20;
        if (sStack_4d10 <= uVar20) {
          sStack_4d10 = uVar20;
        }
        uVar20 = CONCAT44((int)((uint)bVar35 << 0x1f) >> 0x1f,(int)((uint)bVar35 << 0x1f) >> 0x1f);
        BVar52 = (BBox1f)(~uVar20 & (ulong)BVar52 | uVar32 & uVar20);
        pBVar27 = pBVar27 + 0x12;
        local_4dd8 = (BBox1f)((long)local_4dd8 - 1);
      } while (local_4dd8 != (BBox1f)0x0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    lower.field_0 = aVar49;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    upper.field_0 = aVar47;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    lower.field_0 = aVar45;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    upper.field_0 = aVar43;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
    field_0 = aVar41;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
    field_0 = aVar39;
    (__return_storage_ptr__->object_range)._begin = local_4d28;
    (__return_storage_ptr__->object_range)._end = uStack_4d20;
    __return_storage_ptr__->num_time_segments = local_4d18;
    __return_storage_ptr__->max_num_time_segments = sStack_4d10;
    __return_storage_ptr__->max_time_range = BVar52;
    __return_storage_ptr__->time_range = local_4de0;
    return __return_storage_ptr__;
  }
  prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar19,"task cancelled");
  __cxa_throw(prVar19,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlurGrid(Scene* scene, mvector<PrimRefMB>& prims, BuildProgressMonitor& progressMonitor, BBox1f t0t1 = BBox1f(0.0f,1.0f))
      {
        /* first run to get #primitives */
        ParallelForForPrefixSumState<PrimInfoMB> pstate;
        Scene::Iterator<GridMesh,true> iter(scene);

        pstate.init(iter,size_t(1024));
        /* iterate over all meshes in the scene */
        PrimInfoMB pinfoMB = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](GridMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfoMB {
            
            PrimInfoMB pinfoMB(empty);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              if (!mesh->valid(j, mesh->timeSegmentRange(t0t1))) continue;
              LBBox3fa bounds(empty);
              PrimInfoMB gridMB(0,mesh->getNumSubGrids(j));
              pinfoMB.merge(gridMB);
            }
            return pinfoMB;
          }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        
        size_t numPrimitives = pinfoMB.size();
        if (numPrimitives == 0) return pinfoMB;

        /* resize arrays */
        sgrids.resize(numPrimitives); 
        prims.resize(numPrimitives); 
        /* second run to fill primrefs and SubGridBuildData arrays */
        pinfoMB = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](GridMesh* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
            
            k = base.size();
            size_t p_index = k;
            PrimInfoMB pinfoMB(empty);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              if (!mesh->valid(j, mesh->timeSegmentRange(t0t1))) continue;
              const GridMesh::Grid &g = mesh->grid(j);
              
              for (unsigned int y=0; y<g.resY-1u; y+=2)
                for (unsigned int x=0; x<g.resX-1u; x+=2)
                {
                  const PrimRefMB prim(mesh->linearBounds(g,x,y,t0t1),mesh->numTimeSegments(),mesh->time_range,mesh->numTimeSegments(),unsigned(geomID),unsigned(p_index));
                  pinfoMB.add_primref(prim);
                  sgrids[p_index] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
                  prims[p_index++] = prim;                
                }
            }
            return pinfoMB;
          }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        
        assert(pinfoMB.size() == numPrimitives);
        pinfoMB.time_range = t0t1;
        return pinfoMB;
      }